

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O3

int __thiscall rw::d3d9::ObjPipeline::init(ObjPipeline *this,EVP_PKEY_CTX *ctx)

{
  rw::ObjPipeline::init(&this->super_ObjPipeline,(EVP_PKEY_CTX *)0x9);
  (this->super_ObjPipeline).impl.instance = instance;
  (this->super_ObjPipeline).impl.uninstance = uninstance;
  (this->super_ObjPipeline).impl.render = render;
  this->instanceCB = (_func_void_Geometry_ptr_InstanceDataHeader_ptr_bool32 *)0x0;
  this->uninstanceCB = (_func_void_Geometry_ptr_InstanceDataHeader_ptr *)0x0;
  this->renderCB = (_func_void_Atomic_ptr_InstanceDataHeader_ptr_conflict *)0x0;
  return 0x115997;
}

Assistant:

void
ObjPipeline::init(void)
{
	this->rw::ObjPipeline::init(PLATFORM_D3D9);
	this->impl.instance = d3d9::instance;
	this->impl.uninstance = d3d9::uninstance;
	this->impl.render = d3d9::render;
	this->instanceCB = nil;
	this->uninstanceCB = nil;
	this->renderCB = nil;
}